

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void __thiscall pstack::Elf::Notes::iterator::startSection(iterator *this)

{
  Elf64_Off EVar1;
  element_type *peVar2;
  pointer pEVar3;
  allocator<char> local_41;
  string local_40 [32];
  shared_ptr<const_pstack::Reader> local_20;
  iterator *local_10;
  iterator *this_local;
  
  this->offset = 0;
  local_10 = this;
  peVar2 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->object->io);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"note section",&local_41);
  pEVar3 = __gnu_cxx::
           __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
           ::operator->(&this->phdrsi);
  EVar1 = pEVar3->p_offset;
  pEVar3 = __gnu_cxx::
           __normal_iterator<const_Elf64_Phdr_*,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>
           ::operator->(&this->phdrsi);
  (*peVar2->_vptr_Reader[9])(&local_20,peVar2,local_40,EVar1,pEVar3->p_filesz);
  std::shared_ptr<const_pstack::Reader>::operator=(&this->io,&local_20);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void Notes::iterator::startSection() {
    offset = 0;
    io = object->io->view("note section", Off(phdrsi->p_offset), size_t(phdrsi->p_filesz));
}